

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

proxy * __thiscall
cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
alloc<int,int,cs_impl::any::holder<std::_Ios_Seekdir>*>
          (allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider> *this,
          int *args,int *args_1,holder<std::_Ios_Seekdir> **args_2)

{
  int iVar1;
  long lVar2;
  holder<std::_Ios_Seekdir> *phVar3;
  int iVar4;
  proxy *ppVar5;
  
  if ((*(long *)(this + 0x1008) == 0) || (global_thread_counter != 0)) {
    ppVar5 = (proxy *)operator_new(0x18);
  }
  else {
    lVar2 = *(long *)(this + 0x1008);
    *(long *)(this + 0x1008) = lVar2 + -1;
    ppVar5 = *(proxy **)(this + lVar2 * 8 + -8);
  }
  iVar4 = *args;
  iVar1 = *args_1;
  phVar3 = *args_2;
  ppVar5->is_rvalue = false;
  ppVar5->protect_level = (short)iVar4;
  ppVar5->refcount = (long)iVar1;
  ppVar5->data = &phVar3->super_baseHolder;
  return ppVar5;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}